

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triangle.h
# Opt level: O0

pair<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *
anurbs::Triangle<3L>::projection
          (pair<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>
           *__return_storage_ptr__,Vector *point,Vector *a,Vector *b,Vector *c)

{
  MatrixBase<Eigen::Matrix<double,1,3,1,1,3>> *pMVar1;
  ReturnType RVar2;
  ReturnType RVar3;
  Matrix<double,_1,_3,_1,_1,_3> local_2c0;
  type local_2a8;
  type local_280;
  type local_258;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
  local_230;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
  local_1d0;
  undefined1 local_138 [8];
  Vector closest_point;
  double t;
  double local_100;
  double s;
  double local_e0;
  double r;
  Matrix<double,1,3,1,1,3> local_c0 [8];
  Vector w;
  Vector n;
  Matrix<double,1,3,1,1,3> local_78 [8];
  Vector v;
  Matrix<double,1,3,1,1,3> local_48 [8];
  Vector u;
  Vector *c_local;
  Vector *b_local;
  Vector *a_local;
  Vector *point_local;
  
  u.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[2] =
       (double)c;
  Eigen::MatrixBase<Eigen::Matrix<double,1,3,1,1,3>>::operator-
            ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>
              *)(v.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
                 array + 2),(MatrixBase<Eigen::Matrix<double,1,3,1,1,3>> *)b,
             (MatrixBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)a);
  Eigen::Matrix<double,1,3,1,1,3>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,1,3,1,1,3>const,Eigen::Matrix<double,1,3,1,1,3>const>>
            (local_48,(EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                       *)(v.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                          m_data.array + 2));
  Eigen::MatrixBase<Eigen::Matrix<double,1,3,1,1,3>>::operator-
            ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>
              *)(n.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
                 array + 2),(MatrixBase<Eigen::Matrix<double,1,3,1,1,3>> *)c,
             (MatrixBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)a);
  Eigen::Matrix<double,1,3,1,1,3>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,1,3,1,1,3>const,Eigen::Matrix<double,1,3,1,1,3>const>>
            (local_78,(EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                       *)(n.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                          m_data.array + 2));
  Eigen::MatrixBase<Eigen::Matrix<double,1,3,1,1,3>>::cross<Eigen::Matrix<double,1,3,1,1,3>>
            ((type *)(w.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                      m_data.array + 2),(MatrixBase<Eigen::Matrix<double,1,3,1,1,3>> *)local_48,
             (MatrixBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)local_78);
  Eigen::MatrixBase<Eigen::Matrix<double,1,3,1,1,3>>::operator-
            ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>
              *)&r,(MatrixBase<Eigen::Matrix<double,1,3,1,1,3>> *)point,
             (MatrixBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)a);
  Eigen::Matrix<double,1,3,1,1,3>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,1,3,1,1,3>const,Eigen::Matrix<double,1,3,1,1,3>const>>
            (local_c0,(EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                       *)&r);
  Eigen::MatrixBase<Eigen::Matrix<double,1,3,1,1,3>>::cross<Eigen::Matrix<double,1,3,1,1,3>>
            ((type *)&s,(MatrixBase<Eigen::Matrix<double,1,3,1,1,3>> *)local_48,
             (MatrixBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)local_c0);
  RVar2 = Eigen::MatrixBase<Eigen::Matrix<double,1,3,1,1,3>>::dot<Eigen::Matrix<double,1,3,1,1,3>>
                    ((MatrixBase<Eigen::Matrix<double,1,3,1,1,3>> *)&s,
                     (MatrixBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)
                     (w.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                      m_data.array + 2));
  pMVar1 = (MatrixBase<Eigen::Matrix<double,1,3,1,1,3>> *)
           (w.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array +
           2);
  RVar3 = Eigen::MatrixBase<Eigen::Matrix<double,1,3,1,1,3>>::dot<Eigen::Matrix<double,1,3,1,1,3>>
                    (pMVar1,(MatrixBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)pMVar1);
  local_e0 = RVar2 / RVar3;
  Eigen::MatrixBase<Eigen::Matrix<double,1,3,1,1,3>>::cross<Eigen::Matrix<double,1,3,1,1,3>>
            ((type *)&t,(MatrixBase<Eigen::Matrix<double,1,3,1,1,3>> *)local_c0,
             (MatrixBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)local_78);
  RVar2 = Eigen::MatrixBase<Eigen::Matrix<double,1,3,1,1,3>>::dot<Eigen::Matrix<double,1,3,1,1,3>>
                    ((MatrixBase<Eigen::Matrix<double,1,3,1,1,3>> *)&t,
                     (MatrixBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)
                     (w.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                      m_data.array + 2));
  pMVar1 = (MatrixBase<Eigen::Matrix<double,1,3,1,1,3>> *)
           (w.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array +
           2);
  RVar3 = Eigen::MatrixBase<Eigen::Matrix<double,1,3,1,1,3>>::dot<Eigen::Matrix<double,1,3,1,1,3>>
                    (pMVar1,(MatrixBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)pMVar1);
  local_100 = RVar2 / RVar3;
  closest_point.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
  [2] = (1.0 - local_e0) - local_100;
  Eigen::operator*(&local_258,
                   closest_point.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                   m_storage.m_data.array + 2,(StorageBaseType *)a);
  Eigen::operator*(&local_280,&local_100,(StorageBaseType *)b);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Matrix<double,1,3,1,1,3>const>>
  ::operator+(&local_230,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Matrix<double,1,3,1,1,3>const>>
               *)&local_258,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
               *)&local_280);
  Eigen::operator*(&local_2a8,&local_e0,(StorageBaseType *)c);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Matrix<double,1,3,1,1,3>const>const>>
  ::operator+(&local_1d0,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Matrix<double,1,3,1,1,3>const>const>>
               *)&local_230,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
               *)&local_2a8);
  Eigen::Matrix<double,1,3,1,1,3>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Matrix<double,1,3,1,1,3>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Matrix<double,1,3,1,1,3>const>const>>
            ((Matrix<double,1,3,1,1,3> *)local_138,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
              *)&local_1d0);
  Eigen::Matrix<double,_1,_3,_1,_1,_3>::Matrix
            (&local_2c0,
             closest_point.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
             m_data.array + 2,&local_100,&local_e0);
  std::pair<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>::
  pair<Eigen::Matrix<double,_1,_3,_1,_1,_3>_&,_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_true>
            (__return_storage_ptr__,(Matrix<double,_1,_3,_1,_1,_3> *)local_138,&local_2c0);
  return __return_storage_ptr__;
}

Assistant:

static std::pair<Vector, Parameter> projection(Vector point, Vector a, Vector b, Vector c)
    {
        Vector u = b - a;
        Vector v = c - a;
        Vector n = u.cross(v);
        Vector w = point - a;

        double r = u.cross(w).dot(n) / n.dot(n);
        double s = w.cross(v).dot(n) / n.dot(n);
        double t = 1.0 - r - s;

        Vector closest_point = t * a + s * b + r * c;

        return {closest_point, Parameter(t, s, r)};
    }